

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QString * QRegularExpression::anchoredPattern(QStringView expression)

{
  long lVar1;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  *in_stack_fffffffffffffed8;
  QStringView *in_stack_fffffffffffffee0;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&> *a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  QString::QString((QString *)0x72fb7d);
  Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_stack_fffffffffffffee0);
  ::operator+((QString *)a,(QLatin1String *)in_stack_fffffffffffffee0);
  ::operator+(&a->a,in_stack_fffffffffffffee0);
  Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_stack_fffffffffffffee0);
  ::operator+(a,(QLatin1String *)in_stack_fffffffffffffee0);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffed8);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
                     *)0x72fc22);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&> *)0x72fc2f);
  QStringBuilder<QString,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1String> *)0x72fc39);
  QString::~QString((QString *)0x72fc43);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::anchoredPattern(QStringView expression)
{
    return QString()
           + "\\A(?:"_L1
           + expression
           + ")\\z"_L1;
}